

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unify_const_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::UnifyConstantPass::Process(UnifyConstantPass *this)

{
  TrieNodeMap *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  Op OVar3;
  Instruction *pIVar4;
  IRContext *pIVar5;
  DefUseManager *this_01;
  pointer pOVar6;
  pointer pOVar7;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var8;
  _Hash_node_base *p_Var9;
  __buckets_ptr pp_Var10;
  undefined8 *puVar11;
  long *plVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  __node_ptr p_Var15;
  Node *pNVar16;
  __node_ptr p_Var17;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var18;
  Instruction *pIVar19;
  uint uVar20;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> __key;
  size_type __n;
  ulong uVar21;
  ulong uVar22;
  Status SVar23;
  pointer __ptr_1;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> _Var24;
  Instruction *__range3;
  Op *pOVar25;
  _Hash_node_base _Var26;
  Instruction *pIVar27;
  Op *pOVar28;
  __hash_code __code;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var29;
  undefined1 auVar30 [16];
  __buckets_alloc_type __alloc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> keys;
  ResultIdTrie defined_constants;
  Op local_b0;
  new_allocator<std::__detail::_Hash_node_base_*> local_a9;
  Op *local_a8;
  Op *pOStack_a0;
  long local_98;
  undefined8 local_90;
  __node_ptr local_88;
  Op *local_80;
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> local_78;
  Op local_70 [2];
  _Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false> local_68;
  UnifyConstantPass *local_60;
  Instruction *local_58;
  Instruction *local_50;
  ulong local_48;
  ulong local_40;
  __uniq_ptr_impl<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  local_38;
  
  local_78._M_head_impl = (Node *)operator_new(0x40);
  (local_78._M_head_impl)->result_id_ = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_buckets = (__buckets_ptr)0x0;
  ((local_78._M_head_impl)->next_)._M_h._M_bucket_count = 0;
  *(undefined8 *)&((local_78._M_head_impl)->next_)._M_h._M_rehash_policy = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ((local_78._M_head_impl)->next_)._M_h._M_buckets =
       &((local_78._M_head_impl)->next_)._M_h._M_single_bucket;
  ((local_78._M_head_impl)->next_)._M_h._M_bucket_count = 1;
  ((local_78._M_head_impl)->next_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  ((local_78._M_head_impl)->next_)._M_h._M_element_count = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  ((local_78._M_head_impl)->next_)._M_h._M_rehash_policy._M_next_resize = 0;
  ((local_78._M_head_impl)->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pIVar19 = *(Instruction **)
             ((long)&(((((this->super_Pass).context_)->module_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                       .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                     types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (pIVar19 == (Instruction *)0x0) {
    SVar23 = SuccessWithoutChange;
  }
  else {
    local_90 = 0;
    local_60 = this;
    do {
      pIVar4 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar27 = (Instruction *)0x0;
      if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar27 = pIVar4;
      }
      pIVar5 = (this->super_Pass).context_;
      if ((pIVar5->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar5);
      }
      this_01 = (pIVar5->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      uVar13 = 0;
      if (pIVar19->has_result_id_ == true) {
        uVar13 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
      }
      analysis::DefUseManager::GetAnnotations
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&local_a8,this_01,uVar13);
      pOVar25 = pOStack_a0;
      pOVar28 = local_a8;
      if (local_a8 != (Op *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      if (pOVar25 == pOVar28) {
        OVar3 = pIVar19->opcode_;
        uVar20 = OVar3 - OpConstantTrue;
        if ((uVar20 < 6) || (uVar20 = OVar3 - OpSpecConstantComposite, uVar20 < 2)) {
          __key._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)uVar20;
          local_a8 = (Op *)0x0;
          pOStack_a0 = (Op *)0x0;
          local_98 = 0;
          local_70[0] = OVar3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(iterator)0x0,
                     local_70);
          pOVar6 = (pIVar19->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pOVar7 = (pIVar19->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pOVar6 != pOVar7) {
            _Var29._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&(pOVar6->words).small_data_
            ;
            do {
              if (*(int *)((long)_Var29._M_head_impl + -0x20) != 3) {
                _Var8._M_head_impl =
                     *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                      &((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         *)((long)_Var29._M_head_impl + 8))->_M_t;
                if ((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )_Var8._M_head_impl ==
                    (__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )0x0) {
                  __key._M_head_impl =
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (*(long *)((long)_Var29._M_head_impl + -0x10) * 4 +
                       *(long *)_Var29._M_head_impl);
                  _Var8._M_head_impl = _Var29._M_head_impl;
                }
                else {
                  __key._M_head_impl =
                       *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                        &((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)((long)_Var8._M_head_impl + 8))->_M_t;
                }
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_range_insert<unsigned_int_const*>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,pOStack_a0
                           ,*(uint **)&((_Var8._M_head_impl)->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl);
              }
              plVar12 = (long *)((long)_Var29._M_head_impl + 0x10);
              _Var29._M_head_impl =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)_Var29._M_head_impl + 0x30);
            } while ((pointer)plVar12 != pOVar7);
          }
          local_80 = pOStack_a0;
          _Var24._M_head_impl = local_78._M_head_impl;
          pOVar25 = local_a8;
          pOVar28 = pOStack_a0;
          local_58 = pIVar19;
          local_50 = pIVar27;
          if (local_a8 != pOStack_a0) {
            do {
              OVar3 = *pOVar25;
              uVar22 = (ulong)OVar3;
              this_00 = &(_Var24._M_head_impl)->next_;
              local_b0 = OVar3;
              p_Var15 = std::
                        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        ::_M_find_node(&this_00->_M_h,
                                       uVar22 % ((_Var24._M_head_impl)->next_)._M_h._M_bucket_count,
                                       &local_b0,(__hash_code)__key._M_head_impl);
              if (p_Var15 == (__node_ptr)0x0) {
                pNVar16 = (Node *)operator_new(0x40);
                pNVar16->result_id_ = 0;
                (pNVar16->next_)._M_h._M_buckets = (__buckets_ptr)0x0;
                (pNVar16->next_)._M_h._M_bucket_count = 0;
                *(undefined8 *)&(pNVar16->next_)._M_h._M_rehash_policy = 0;
                (pNVar16->next_)._M_h._M_rehash_policy._M_next_resize = 0;
                (pNVar16->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                (pNVar16->next_)._M_h._M_buckets = &(pNVar16->next_)._M_h._M_single_bucket;
                (pNVar16->next_)._M_h._M_bucket_count = 1;
                (pNVar16->next_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                (pNVar16->next_)._M_h._M_element_count = 0;
                (pNVar16->next_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
                (pNVar16->next_)._M_h._M_rehash_policy._M_next_resize = 0;
                (pNVar16->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                local_38._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                .
                super__Head_base<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_false>
                ._M_head_impl =
                     (tuple<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                      )(_Tuple_impl<0UL,_spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node_*,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                        )0x0;
                local_70[0] = OVar3;
                local_68._M_head_impl = pNVar16;
                p_Var17 = (__node_ptr)operator_new(0x18);
                (p_Var17->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
                __key._M_head_impl =
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &p_Var17->
                      super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                ;
                *(Op *)&(p_Var17->
                        super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                        ._M_storage._M_storage = OVar3;
                *(Node **)((long)&(p_Var17->
                                  super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                  ._M_storage._M_storage + 8) = pNVar16;
                local_68._M_head_impl = (Node *)0x0;
                uVar21 = ((_Var24._M_head_impl)->next_)._M_h._M_bucket_count;
                local_40 = uVar22 % uVar21;
                p_Var15 = std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::_M_find_node(&this_00->_M_h,local_40,(key_type *)__key._M_head_impl,
                                         (__hash_code)__key._M_head_impl);
                if (p_Var15 == (__node_ptr)0x0) {
                  local_88 = p_Var17;
                  local_48 = uVar22;
                  auVar30 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                                      ((ulong)&((_Var24._M_head_impl)->next_)._M_h._M_rehash_policy,
                                       uVar21,((_Var24._M_head_impl)->next_)._M_h._M_element_count);
                  __n = auVar30._8_8_;
                  uVar22 = local_40;
                  if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    if (__n == 1) {
                      __s = &((_Var24._M_head_impl)->next_)._M_h._M_single_bucket;
                      ((_Var24._M_head_impl)->next_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
                    }
                    else {
                      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                      (&local_a9,__n,(void *)0x0);
                      memset(__s,0,__n * 8);
                    }
                    _Var26._M_nxt = ((_Var24._M_head_impl)->next_)._M_h._M_before_begin._M_nxt;
                    ((_Var24._M_head_impl)->next_)._M_h._M_before_begin._M_nxt =
                         (_Hash_node_base *)0x0;
                    if (_Var26._M_nxt != (_Hash_node_base *)0x0) {
                      p_Var1 = &((_Var24._M_head_impl)->next_)._M_h._M_before_begin;
                      uVar22 = 0;
                      do {
                        p_Var9 = (_Var26._M_nxt)->_M_nxt;
                        uVar21 = (ulong)*(uint *)&_Var26._M_nxt[1]._M_nxt % __n;
                        if (__s[uVar21] == (_Hash_node_base *)0x0) {
                          (_Var26._M_nxt)->_M_nxt = p_Var1->_M_nxt;
                          p_Var1->_M_nxt = _Var26._M_nxt;
                          __s[uVar21] = p_Var1;
                          if ((_Var26._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                            pp_Var18 = __s + uVar22;
                            goto LAB_0055663a;
                          }
                        }
                        else {
                          (_Var26._M_nxt)->_M_nxt = __s[uVar21]->_M_nxt;
                          pp_Var18 = &__s[uVar21]->_M_nxt;
                          uVar21 = uVar22;
LAB_0055663a:
                          *pp_Var18 = _Var26._M_nxt;
                        }
                        _Var26._M_nxt = p_Var9;
                        uVar22 = uVar21;
                      } while (p_Var9 != (_Hash_node_base *)0x0);
                    }
                    pp_Var10 = ((_Var24._M_head_impl)->next_)._M_h._M_buckets;
                    if (&((_Var24._M_head_impl)->next_)._M_h._M_single_bucket != pp_Var10) {
                      operator_delete(pp_Var10,((_Var24._M_head_impl)->next_)._M_h._M_bucket_count
                                               << 3);
                    }
                    ((_Var24._M_head_impl)->next_)._M_h._M_bucket_count = __n;
                    ((_Var24._M_head_impl)->next_)._M_h._M_buckets = __s;
                    uVar22 = local_48 % __n;
                  }
                  __key._M_head_impl =
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       (this_00->_M_h)._M_buckets;
                  puVar11 = *(undefined8 **)
                             ((long)&(((_Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                        *)__key._M_head_impl)->
                                     super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                     )._M_storage._M_storage + uVar22 * 8);
                  if (puVar11 == (undefined8 *)0x0) {
                    p_Var9 = ((_Var24._M_head_impl)->next_)._M_h._M_before_begin._M_nxt;
                    (local_88->super__Hash_node_base)._M_nxt = p_Var9;
                    ((_Var24._M_head_impl)->next_)._M_h._M_before_begin._M_nxt =
                         &local_88->super__Hash_node_base;
                    if (p_Var9 != (_Hash_node_base *)0x0) {
                      *(__node_ptr *)
                       ((long)&(((_Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                  *)__key._M_head_impl)->
                               super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                               )._M_storage._M_storage +
                       ((ulong)*(uint *)&p_Var9[1]._M_nxt %
                       ((_Var24._M_head_impl)->next_)._M_h._M_bucket_count) * 8) = local_88;
                    }
                    __key._M_head_impl =
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (this_00->_M_h)._M_buckets;
                    *(__node_base **)
                     ((long)&(((_Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                *)__key._M_head_impl)->
                             super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                             )._M_storage._M_storage + uVar22 * 8) =
                         &((_Var24._M_head_impl)->next_)._M_h._M_before_begin;
                  }
                  else {
                    (local_88->super__Hash_node_base)._M_nxt = (_Hash_node_base *)*puVar11;
                    **(undefined8 **)
                      ((long)&(((_Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                 *)__key._M_head_impl)->
                              super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                              )._M_storage._M_storage + uVar22 * 8) = local_88;
                  }
                  psVar2 = &((_Var24._M_head_impl)->next_)._M_h._M_element_count;
                  *psVar2 = *psVar2 + 1;
                  p_Var17 = (__node_ptr)0x0;
                  p_Var15 = local_88;
                }
                pOVar28 = local_80;
                if (p_Var17 != (__node_ptr)0x0) {
                  std::
                  unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                  ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                                 *)((long)&(p_Var17->
                                           super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                           ._M_storage._M_storage + 8));
                  operator_delete(p_Var17,0x18);
                }
                _Var24._M_head_impl =
                     *(Node **)((long)&(p_Var15->
                                       super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                       ._M_storage._M_storage + 8);
                std::
                unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                               *)&local_68);
                std::
                unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                               *)&local_38);
              }
              else {
                _Var24._M_head_impl =
                     *(Node **)((long)&(p_Var15->
                                       super__Hash_node_value<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_int,_std::unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>_>_>
                                       ._M_storage._M_storage + 8);
              }
              pOVar25 = pOVar25 + 1;
            } while (pOVar25 != pOVar28);
          }
          pIVar27 = local_50;
          pIVar19 = local_58;
          this = local_60;
          if ((_Var24._M_head_impl)->result_id_ == 0) {
            uVar13 = 0;
            if (local_58->has_result_id_ == true) {
              uVar13 = Instruction::GetSingleWordOperand(local_58,(uint)local_58->has_type_id_);
            }
            (_Var24._M_head_impl)->result_id_ = uVar13;
          }
          uVar13 = (_Var24._M_head_impl)->result_id_;
          if (local_a8 != (Op *)0x0) {
            operator_delete(local_a8,local_98 - (long)local_a8);
          }
          uVar14 = 0;
          if (pIVar19->has_result_id_ == true) {
            uVar14 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
          }
          if (uVar13 != uVar14) {
            pIVar5 = (this->super_Pass).context_;
            uVar14 = 0;
            if (pIVar19->has_result_id_ == true) {
              uVar14 = Instruction::GetSingleWordOperand(pIVar19,(uint)pIVar19->has_type_id_);
            }
            IRContext::ReplaceAllUsesWith(pIVar5,uVar14,uVar13);
            pIVar19 = IRContext::KillInst((this->super_Pass).context_,pIVar19);
            local_90 = CONCAT71((int7)((ulong)pIVar19 >> 8),1);
          }
        }
      }
      pIVar19 = pIVar27;
    } while (pIVar27 != (Instruction *)0x0);
    SVar23 = (byte)local_90 & 1 ^ SuccessWithoutChange;
  }
  std::
  unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
  ::~unique_ptr((unique_ptr<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node,_std::default_delete<spvtools::opt::(anonymous_namespace)::ResultIdTrie::Node>_>
                 *)&local_78);
  return SVar23;
}

Assistant:

Pass::Status UnifyConstantPass::Process() {
  bool modified = false;
  ResultIdTrie defined_constants;

  for (Instruction *next_instruction,
       *inst = &*(context()->types_values_begin());
       inst; inst = next_instruction) {
    next_instruction = inst->NextNode();

    // Do not handle the instruction when there are decorations upon the result
    // id.
    if (get_def_use_mgr()->GetAnnotations(inst->result_id()).size() != 0) {
      continue;
    }

    // The overall algorithm is to store the result ids of all the eligible
    // constants encountered so far in a trie. For a constant defining
    // instruction under consideration, use its opcode, result type id and
    // words in operands as an array of keys to lookup the trie. If a result id
    // can be found for that array of keys, a constant with exactly the same
    // value must has been defined before, the constant under processing
    // should be replaced by the constant previously defined. If no such result
    // id can be found for that array of keys, this must be the first time a
    // constant with its value be defined, we then create a new trie node to
    // store the result id with the keys. When replacing a duplicated constant
    // with a previously defined constant, all the uses of the duplicated
    // constant, which must be placed after the duplicated constant defining
    // instruction, will be updated. This way, the descendants of the
    // previously defined constant and the duplicated constant will both refer
    // to the previously defined constant. So that the operand ids which are
    // used in key arrays will be the ids of the unified constants, when
    // processing is up to a descendant. This makes comparing the key array
    // always valid for judging duplication.
    switch (inst->opcode()) {
      case spv::Op::OpConstantTrue:
      case spv::Op::OpConstantFalse:
      case spv::Op::OpConstant:
      case spv::Op::OpConstantNull:
      case spv::Op::OpConstantSampler:
      case spv::Op::OpConstantComposite:
      // Only spec constants defined with OpSpecConstantOp and
      // OpSpecConstantComposite should be processed in this pass. Spec
      // constants defined with OpSpecConstant{|True|False} are decorated with
      // 'SpecId' decoration and all of them should be treated as unique.
      // 'SpecId' is not applicable to SpecConstants defined with
      // OpSpecConstant{Op|Composite}, their values are not necessary to be
      // unique. When all the operands/components are the same between two
      // OpSpecConstant{Op|Composite} results, their result values must be the
      // same so are unifiable.
      case spv::Op::OpSpecConstantOp:
      case spv::Op::OpSpecConstantComposite: {
        uint32_t id = defined_constants.LookupEquivalentResultFor(*inst);
        if (id != inst->result_id()) {
          // The constant is a duplicated one, use the cached constant to
          // replace the uses of this duplicated one, then turn it to nop.
          context()->ReplaceAllUsesWith(inst->result_id(), id);
          context()->KillInst(inst);
          modified = true;
        }
        break;
      }
      default:
        break;
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}